

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O1

int32 dumbfile_igetl(DUMBFILE *f)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  if (f->pos < 0) {
    uVar4 = 0xffffffff;
  }
  else {
    uVar1 = (*f->dfs->getc)(f->file);
    lVar5 = -1;
    uVar4 = uVar1;
    if ((((-1 < (int)uVar1) && (uVar2 = (*f->dfs->getc)(f->file), uVar4 = uVar2, -1 < (int)uVar2))
        && (uVar3 = (*f->dfs->getc)(f->file), uVar4 = uVar3, -1 < (int)uVar3)) &&
       (uVar4 = (*f->dfs->getc)(f->file), -1 < (int)uVar4)) {
      uVar4 = uVar4 << 0x18 | uVar1 | uVar2 << 8 | uVar3 << 0x10;
      lVar5 = f->pos + 4;
    }
    f->pos = lVar5;
  }
  return uVar4;
}

Assistant:

int32 DUMBEXPORT dumbfile_igetl(DUMBFILE *f)
{
	uint32 rv, b;

	ASSERT(f);

	if (f->pos < 0)
		return -1;

	rv = (*f->dfs->getc)(f->file);
	if ((sint32)rv < 0) {
		f->pos = -1;
		return rv;
	}

	b = (*f->dfs->getc)(f->file);
	if ((sint32)b < 0) {
		f->pos = -1;
		return b;
	}
	rv |= b << 8;

	b = (*f->dfs->getc)(f->file);
	if ((sint32)b < 0) {
		f->pos = -1;
		return b;
	}
	rv |= b << 16;

	b = (*f->dfs->getc)(f->file);
	if ((sint32)b < 0) {
		f->pos = -1;
		return b;
	}
	rv |= b << 24;

	f->pos += 4;

	return rv;
}